

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ExpectationBase * __thiscall
testing::internal::FunctionMocker<void_(ot::commissioner::Error)>::UntypedFindMatchingExpectation
          (FunctionMocker<void_(ot::commissioner::Error)> *this,void *untyped_args,
          void **untyped_action,bool *is_excessive,ostream *what,ostream *why)

{
  bool bVar1;
  Action<void_(ot::commissioner::Error)> *local_70;
  Action<void_(ot::commissioner::Error)> *action;
  TypedExpectation<void_(ot::commissioner::Error)> *exp;
  MutexLock l;
  ArgumentTuple *args;
  ostream *why_local;
  ostream *what_local;
  bool *is_excessive_local;
  void **untyped_action_local;
  void *untyped_args_local;
  FunctionMocker<void_(ot::commissioner::Error)> *this_local;
  
  l.mutex_ = (MutexBase *)untyped_args;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)&exp,(MutexBase *)g_gmock_mutex);
  this_local = (FunctionMocker<void_(ot::commissioner::Error)> *)
               FindMatchingExpectationLocked(this,(ArgumentTuple *)l.mutex_);
  if ((ExpectationBase *)this_local == (ExpectationBase *)0x0) {
    FormatUnexpectedCallMessageLocked(this,(ArgumentTuple *)l.mutex_,what,why);
    this_local = (FunctionMocker<void_(ot::commissioner::Error)> *)0x0;
  }
  else {
    bVar1 = ExpectationBase::IsSaturated((ExpectationBase *)this_local);
    *is_excessive = bVar1;
    local_70 = TypedExpectation<void_(ot::commissioner::Error)>::GetActionForArguments
                         ((TypedExpectation<void_(ot::commissioner::Error)> *)this_local,this,
                          (ArgumentTuple *)l.mutex_,what,why);
    if ((local_70 != (Action<void_(ot::commissioner::Error)> *)0x0) &&
       (bVar1 = Action<void_(ot::commissioner::Error)>::IsDoDefault(local_70), bVar1)) {
      local_70 = (Action<void_(ot::commissioner::Error)> *)0x0;
    }
    *untyped_action = local_70;
  }
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&exp);
  return (ExpectationBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }